

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CmdLineParser.h
# Opt level: O2

bool __thiscall
axl::sl::CmdLineParser<CmdLineParser,_CmdLineSwitchTable>::processArg
          (CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *this,StringRef *arg)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  ArgKind argKind;
  SwitchInfo *pSVar4;
  C *pCVar5;
  SwitchKind unaff_R13D;
  ulong first;
  String switchName;
  StringRef local_78;
  String value;
  
  if (((this->super_CmdLineParserRoot).m_flags & 1) != 0) {
    bVar2 = CmdLineParser::onValue((CmdLineParser *)this,arg);
    return bVar2;
  }
  switchName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length._0_1_ = 0;
  switchName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length._1_7_ = 0;
  switchName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_isNullTerminated = false
  ;
  switchName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p = (C *)0x0;
  switchName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr._0_1_ = 0;
  switchName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr._1_7_ = 0;
  value.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length._0_1_ = 0;
  value.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>._17_8_ = 0;
  value.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p = (C *)0x0;
  value.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr._0_1_ = 0;
  value.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr._1_7_ = 0;
  argKind = CmdLineParserRoot::getArgKind(arg);
  if (argKind == ArgKind_Value) {
    bVar3 = processValue(this,arg);
  }
  else if (argKind == ArgKind_StringSwitch) {
    StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getSubString
              (&local_78,arg,2,0xffffffffffffffff);
    bVar2 = CmdLineParserRoot::parseSwitch(ArgKind_StringSwitch,&local_78,&switchName,&value);
    StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_78);
    if (bVar2) {
      pSVar4 = CmdLineSwitchTable::findSwitch
                         (&switchName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
      if (pSVar4 == (SwitchInfo *)0x0) {
        pCVar5 = switchName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p;
        if (CONCAT71(switchName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
                     m_length._1_7_,
                     (undefined1)
                     switchName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
                     m_length) == 0) {
          pCVar5 = &StringDetailsImpl<char>::getEmptyString()::emptyString;
        }
        bVar3 = 0;
        err::setFormatStringError("unknown switch --%s",pCVar5);
      }
      else {
        bVar3 = processSwitch(this,pSVar4,
                              &switchName.
                               super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>,
                              &value.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
      }
    }
    else {
      bVar3 = 0;
    }
  }
  else {
    uVar1 = arg->m_length;
    for (first = 1; bVar3 = (byte)unaff_R13D, first < uVar1; first = first + 1) {
      pSVar4 = CmdLineSwitchTable::findSwitch(arg->m_p[first]);
      if (pSVar4 == (SwitchInfo *)0x0) {
        bVar3 = 0;
        err::setFormatStringError("unknown switch -%c",(ulong)(byte)arg->m_p[first]);
        break;
      }
      if (pSVar4->m_value != (char *)0x0) {
        StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getSubString
                  (&local_78,arg,first,0xffffffffffffffff);
        bVar2 = CmdLineParserRoot::parseSwitch(argKind,&local_78,&switchName,&value);
        if (bVar2) {
          bVar3 = processSwitch(this,pSVar4,
                                &switchName.
                                 super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>,
                                &value.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>)
          ;
        }
        else {
          bVar3 = false;
        }
        StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_78);
        break;
      }
      unaff_R13D = pSVar4->m_switchKind;
      StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&local_78,(C *)0x0);
      CmdLineParser::onSwitch((CmdLineParser *)this,unaff_R13D,&local_78);
      StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_78);
    }
    bVar3 = uVar1 <= first | bVar3;
  }
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            (&value.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            (&switchName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  return (bool)(bVar3 & 1);
}

Assistant:

bool
	processArg(const sl::StringRef& arg) {
		bool result;

		T* self = static_cast<T*>(this);

		if (m_flags & Flag_Forward)
			return self->onValue(arg);

		sl::String switchName;
		sl::String value;

		ArgKind argKind = getArgKind(arg);
		switch (argKind) {
		case ArgKind_Value:
			return processValue(arg);

		case ArgKind_StringSwitch:
			result = parseSwitch(argKind, arg.getSubString(2), &switchName, &value);
			if (!result)
				return false;

			const SwitchInfo* switchInfo = SwitchTable::findSwitch(switchName);
			if (!switchInfo) {
				err::setFormatStringError("unknown switch --%s", switchName.sz());
				return false;
			}

			return processSwitch(switchInfo, switchName, value);
		}

		ASSERT(argKind == ArgKind_CharSwitch);

		size_t length = arg.getLength();
		for (size_t i = 1; i < length; i++) {
			const SwitchInfo* switchInfo = SwitchTable::findSwitch(arg[i]);
			if (!switchInfo) {
				err::setFormatStringError("unknown switch -%c", (uchar_t) arg [i]);
				return false;
			}

			if (switchInfo->m_value) {
				return
					parseSwitch(argKind, arg.getSubString(i), &switchName, &value) &&
					processSwitch(switchInfo, switchName, value);
			}

			result = self->onSwitch((SwitchKind)switchInfo->m_switchKind, NULL);
		}

		return true;
	}